

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

pair<bool,_unsigned_long> __thiscall
FloatTokenizerRule::tryMatch(FloatTokenizerRule *this,shared_ptr<Readable> *reader)

{
  element_type *peVar1;
  int iVar2;
  size_t i;
  pair<bool,_unsigned_long> pVar3;
  
  peVar1 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar2 = (*peVar1->_vptr_Readable[2])(peVar1,0);
  if ((char)iVar2 == '0') {
    pVar3 = handleFraction(this,reader,1);
  }
  else {
    peVar1 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar2 = (*peVar1->_vptr_Readable[2])(peVar1,0);
    if (('0' < (char)iVar2) &&
       (peVar1 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
       iVar2 = (*peVar1->_vptr_Readable[2])(peVar1,0), (char)iVar2 < ':')) {
      i = 1;
      while (peVar1 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
            iVar2 = (*peVar1->_vptr_Readable[2])(peVar1,i), (byte)((char)iVar2 - 0x30U) < 10) {
        i = i + 1;
      }
      pVar3 = handleFraction(this,reader,i);
      return pVar3;
    }
    pVar3 = (pair<bool,_unsigned_long>)ZEXT816(0);
  }
  return pVar3;
}

Assistant:

std::pair<bool, std::size_t> tryMatch(std::shared_ptr<Readable> reader) noexcept override {
    std::size_t i = 0;

    if (reader->charAt(i) == '0') {
      i++;
      return this->handleFraction(reader, i);
    }

    if ('1' <= reader->charAt(i) && reader->charAt(i) <= '9') {
      i++;
      while (isNumeric(reader->charAt(i))) {
        i++;
      }

      return this->handleFraction(reader, i);
    }

    return std::make_pair(false, 0);
  }